

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

int __thiscall
anon_unknown.dwarf_857c89::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,int index,size_t count)

{
  transform_error *this_00;
  int index_local;
  size_t count_local;
  unsigned_long local_a8;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  index_local = index;
  if (index < 0) {
    index_local = index + (int)count;
  }
  if ((-1 < index_local) && ((uint)index_local < count)) {
    return index_local;
  }
  count_local = count;
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  local_50.View_._M_len = 0x20;
  local_50.View_._M_str = "sub-command TRANSFORM, selector ";
  local_80.View_._M_str = (this->super_TransformSelector).Tag._M_dataplus._M_p;
  local_80.View_._M_len = (this->super_TransformSelector).Tag._M_string_length;
  local_a8 = count - 1;
  cmStrCat<char[10],int,char[17],unsigned_long,char[3],unsigned_long,char[3]>
            (&local_a0,&local_50,&local_80,(char (*) [10])", index: ",&index_local,
             (char (*) [17])" out of range (-",&count_local,(char (*) [3])0x5a4365,&local_a8,
             (char (*) [3])0x58d266);
  transform_error::transform_error(this_00,&local_a0);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

int NormalizeIndex(int index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<int>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      throw transform_error(cmStrCat(
        "sub-command TRANSFORM, selector ", this->Tag, ", index: ", index,
        " out of range (-", count, ", ", count - 1, ")."));
    }
    return index;
  }